

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceProcessor::Normalize
          (SentencePieceProcessor *this,string_view input,string *normalized)

{
  long *plVar1;
  undefined8 in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  void *local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  undefined4 local_190;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  local_1a8 = (void *)0x0;
  uStack_1a0 = 0;
  local_198 = 0;
  plVar1 = *(long **)(input._M_len + 0x10);
  if (plVar1 == (long *)0x0) {
    local_190 = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"src/sentencepiece_processor.cc",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"(",1);
    std::ostream::operator<<((ostream *)local_188,0x3a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"normalizer_",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  else {
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str,normalized,in_R8,&local_1a8);
    if (local_1a8 != (void *)0x0) {
      operator_delete(local_1a8,local_198 - (long)local_1a8);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Normalize(absl::string_view input,
                                               std::string *normalized) const {
  std::vector<size_t> norm_to_orig;
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}